

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  long in_RDI;
  int i;
  int in_stack_ffffffffffffffdc;
  ImGuiWindowTempData *in_stack_ffffffffffffffe0;
  int local_c;
  
  if (*(long *)(in_RDI + 0x2b8) != in_RDI + 0x2c0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xb12,"~ImGuiWindow","ImGui ASSERT FAILED: %s","DrawList == &DrawListInst");
  }
  IM_DELETE<char>((char *)0x2f32a8);
  for (local_c = 0; local_c != *(int *)(in_RDI + 0x2a0); local_c = local_c + 1) {
    in_stack_ffffffffffffffe0 =
         (ImGuiWindowTempData *)
         ImVector<ImGuiColumns>::operator[]
                   ((ImVector<ImGuiColumns> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    ImGuiColumns::~ImGuiColumns((ImGuiColumns *)in_stack_ffffffffffffffe0);
  }
  ImDrawList::~ImDrawList((ImDrawList *)in_stack_ffffffffffffffe0);
  ImVector<ImGuiColumns>::~ImVector((ImVector<ImGuiColumns> *)in_stack_ffffffffffffffe0);
  ImGuiStorage::~ImGuiStorage((ImGuiStorage *)0x2f3329);
  ImGuiWindowTempData::~ImGuiWindowTempData(in_stack_ffffffffffffffe0);
  ImVector<unsigned_int>::~ImVector((ImVector<unsigned_int> *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumns();
}